

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O2

void __thiscall
CommandLineArguments::addExcludeStrictGroupFilter
          (CommandLineArguments *this,int ac,char **av,int *i)

{
  TestFilter *pTVar1;
  int ac_00;
  SimpleString SStack_48;
  
  pTVar1 = (TestFilter *)
           operator_new(0x20,
                        "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                        ,0x124);
  ac_00 = 0x13f2a2;
  SimpleString::SimpleString(&SStack_48,"-xsg");
  getParameterField((CommandLineArguments *)&stack0xffffffffffffffc8,ac_00,(char **)(ulong)(uint)ac,
                    (int *)av,(SimpleString *)i);
  TestFilter::TestFilter(pTVar1,(SimpleString *)&stack0xffffffffffffffc8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
  SimpleString::~SimpleString(&SStack_48);
  TestFilter::strictMatching(pTVar1);
  TestFilter::invertMatching(pTVar1);
  pTVar1 = TestFilter::add(pTVar1,this->groupFilters_);
  this->groupFilters_ = pTVar1;
  return;
}

Assistant:

void CommandLineArguments::addExcludeStrictGroupFilter(int ac, const char *const *av, int& i)
{
    TestFilter* groupFilter = new TestFilter(getParameterField(ac, av, i, "-xsg"));
    groupFilter->strictMatching();
    groupFilter->invertMatching();
    groupFilters_ = groupFilter->add(groupFilters_);
}